

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
::nosize_transfer_element
          (void *param_1,element_type *param_2,undefined8 param_3,undefined8 param_4,
          table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          *param_5)

{
  destroy_element_on_exit d;
  arrays_type *in_stack_ffffffffffffff68;
  path *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  element_type *arrays_;
  
  (param_5->arrays).groups_size_index = (param_5->arrays).groups_size_index + 1;
  arrays_ = param_2;
  position_for((size_t)param_1,in_stack_ffffffffffffff68);
  flat_set_types<std::filesystem::__cxx11::path>::move(param_2);
  nosize_unchecked_emplace_at<std::filesystem::__cxx11::path>
            (param_5,(arrays_type *)arrays_,(size_t)param_1,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  destroy_element_on_exit::~destroy_element_on_exit((destroy_element_on_exit *)0x2efee9);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }